

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O1

int ZIPSetupEncode(TIFF *tif)

{
  uint8_t *puVar1;
  int iVar2;
  char *pcVar3;
  
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    if ((puVar1[0xf4] & 1) != 0) {
      inflateEnd((z_streamp)(puVar1 + 0x80));
      puVar1[0xf4] = '\0';
      puVar1[0xf5] = '\0';
      puVar1[0xf6] = '\0';
      puVar1[0xf7] = '\0';
    }
    iVar2 = 9;
    if (*(int *)(puVar1 + 0xf0) < 9) {
      iVar2 = *(int *)(puVar1 + 0xf0);
    }
    iVar2 = deflateInit_((z_streamp)(puVar1 + 0x80),iVar2,"1.2.11",0x70);
    if (iVar2 == 0) {
      puVar1[0xf4] = puVar1[0xf4] | 2;
      iVar2 = 1;
    }
    else {
      pcVar3 = "";
      if (*(char **)(puVar1 + 0xb0) != (char *)0x0) {
        pcVar3 = *(char **)(puVar1 + 0xb0);
      }
      iVar2 = 0;
      TIFFErrorExtR(tif,"ZIPSetupEncode","%s",pcVar3);
    }
    return iVar2;
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_zip.c"
                ,0x128,"int ZIPSetupEncode(TIFF *)");
}

Assistant:

static int ZIPSetupEncode(TIFF *tif)
{
    static const char module[] = "ZIPSetupEncode";
    ZIPState *sp = EncoderState(tif);
    int cappedQuality;

    assert(sp != NULL);
    if (sp->state & ZSTATE_INIT_DECODE)
    {
        inflateEnd(&sp->stream);
        sp->state = 0;
    }

    cappedQuality = sp->zipquality;
    if (cappedQuality > Z_BEST_COMPRESSION)
        cappedQuality = Z_BEST_COMPRESSION;

    if (deflateInit(&sp->stream, cappedQuality) != Z_OK)
    {
        TIFFErrorExtR(tif, module, "%s", SAFE_MSG(sp));
        return (0);
    }
    else
    {
        sp->state |= ZSTATE_INIT_ENCODE;
        return (1);
    }
}